

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void __thiscall embree::Tutorial::~Tutorial(Tutorial *this)

{
  SceneLoadingTutorialApplication::~SceneLoadingTutorialApplication
            (&this->super_SceneLoadingTutorialApplication);
  ::operator_delete(this);
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES)
    {
#if RTC_MIN_WIDTH
      registerOption("min-width", [] (Ref<ParseStream> cin, const FileName& path) {
          g_min_width = cin->getFloat();
          g_min_width_max_radius_scale = cin->getFloat();
        }, "--min-width <float> <float>: first value sets number of pixel to enlarge curve and point geometry to, but maximally scales hair radii by second value");
#endif

      registerOption("shader", [] (Ref<ParseStream> cin, const FileName& path) {
        std::string mode = cin->getString();
        if      (mode == "default" ) shader = SHADER_DEFAULT;
        else if (mode == "eyelight") shader = SHADER_EYELIGHT;
        else if (mode == "occlusion") shader = SHADER_OCCLUSION;
        else if (mode == "uv"      ) shader = SHADER_UV;
        else if (mode == "texcoords") shader = SHADER_TEXCOORDS;
        else if (mode == "texcoords-grid") shader = SHADER_TEXCOORDS_GRID;
        else if (mode == "Ng"      ) shader = SHADER_NG;
        else if (mode == "cycles"  ) { shader = SHADER_CYCLES; scale = cin->getFloat(); }
        else if (mode == "geomID"  ) shader = SHADER_GEOMID;
        else if (mode == "primID"  ) shader = SHADER_GEOMID_PRIMID;
        else if (mode == "ao" ) shader = SHADER_AO;
        else throw std::runtime_error("invalid shader:" +mode);
      },
      "--shader <string>: sets shader to use at startup\n"
      "  default: default tutorial shader\n"
      "  eyelight: eyelight shading\n"
      "  occlusion: occlusion shading\n"
      "  uv: uv debug shader\n"
      "  texcoords: texture coordinate debug shader\n"
      "  texcoords-grid: grid texture debug shader\n"
      "  Ng: visualization of shading normal\n"
      "  cycles <float>: CPU cycle visualization\n"
      "  ao: ambient occlusion\n"      
      "  geomID: visualization of geometry ID\n"
      "  primID: visualization of geometry and primitive ID");

#if defined(EMBREE_SYCL_TUTORIAL) && !defined(EMBREE_SYCL_RT_SIMULATION)
      registerOption("features", [] (Ref<ParseStream> cin, const FileName& path) {
          g_use_scene_features = false;
          unsigned int feature_mask = RTC_FEATURE_FLAG_NONE;
          while (cin->peek() != "" && cin->peek()[0] != '-') {
            std::string feature = cin->getString();
            std::transform(feature.begin(), feature.end(), feature.begin(), [](unsigned char c){ return toupper(c); });
            if      (feature == "MOTION_BLUR") feature_mask |= RTC_FEATURE_FLAG_MOTION_BLUR;
            else if (feature == "TRIANGLE") feature_mask |= RTC_FEATURE_FLAG_TRIANGLE;
            else if (feature == "QUAD") feature_mask |= RTC_FEATURE_FLAG_QUAD;
            else if (feature == "GRID") feature_mask |= RTC_FEATURE_FLAG_GRID;
            else if (feature == "SUBDIVISION") feature_mask |= RTC_FEATURE_FLAG_SUBDIVISION;
            else if (feature == "CONE_LINEAR_CURVE" ) feature_mask |= RTC_FEATURE_FLAG_CONE_LINEAR_CURVE;
            else if (feature == "ROUND_LINEAR_CURVE") feature_mask |= RTC_FEATURE_FLAG_ROUND_LINEAR_CURVE;
            else if (feature == "FLAT_LINEAR_CURVE" ) feature_mask |= RTC_FEATURE_FLAG_FLAT_LINEAR_CURVE;
            else if (feature == "ROUND_BEZIER_CURVE") feature_mask |= RTC_FEATURE_FLAG_ROUND_BEZIER_CURVE;
            else if (feature == "FLAT_BEZIER_CURVE") feature_mask |= RTC_FEATURE_FLAG_FLAT_BEZIER_CURVE;
            else if (feature == "NORMAL_ORIENTED_BEZIER_CURVE") feature_mask |= RTC_FEATURE_FLAG_NORMAL_ORIENTED_BEZIER_CURVE;
            else if (feature == "ROUND_BSPLINE_CURVE") feature_mask |= RTC_FEATURE_FLAG_ROUND_BSPLINE_CURVE;
            else if (feature == "FLAT_BSPLINE_CURVE") feature_mask |= RTC_FEATURE_FLAG_FLAT_BSPLINE_CURVE;
            else if (feature == "NORMAL_ORIENTED_BSPLINE_CURVE") feature_mask |= RTC_FEATURE_FLAG_NORMAL_ORIENTED_BSPLINE_CURVE;
            else if (feature == "ROUND_HERMITE_CURVE") feature_mask |= RTC_FEATURE_FLAG_ROUND_HERMITE_CURVE;
            else if (feature == "FLAT_HERMITE_CURVE") feature_mask |= RTC_FEATURE_FLAG_FLAT_HERMITE_CURVE;
            else if (feature == "NORMAL_ORIENTED_HERMITE_CURVE") feature_mask |= RTC_FEATURE_FLAG_NORMAL_ORIENTED_HERMITE_CURVE;
            else if (feature == "SPHERE_POINT") feature_mask |= RTC_FEATURE_FLAG_SPHERE_POINT;
            else if (feature == "DISC_POINT") feature_mask |= RTC_FEATURE_FLAG_DISC_POINT;
            else if (feature == "ORIENTED_DISC_POINT") feature_mask |= RTC_FEATURE_FLAG_ORIENTED_DISC_POINT;
            else if (feature == "POINT") feature_mask |= RTC_FEATURE_FLAG_POINT;
            else if (feature == "ROUND_CATMULL_ROM_CURVE") feature_mask |= RTC_FEATURE_FLAG_ROUND_CATMULL_ROM_CURVE;
            else if (feature == "FLAT_CATMULL_ROM_CURVE") feature_mask |= RTC_FEATURE_FLAG_FLAT_CATMULL_ROM_CURVE;
            else if (feature == "NORMAL_ORIENTED_CATMULL_ROM_CURVE") feature_mask |= RTC_FEATURE_FLAG_NORMAL_ORIENTED_CATMULL_ROM_CURVE;
            else if (feature == "ROUND_CURVES") feature_mask |= RTC_FEATURE_FLAG_ROUND_CURVES;
            else if (feature == "FLAT_CURVES") feature_mask |= RTC_FEATURE_FLAG_FLAT_CURVES;
            else if (feature == "NORMAL_ORIENTED_CURVES") feature_mask |= RTC_FEATURE_FLAG_NORMAL_ORIENTED_CURVES;
            else if (feature == "INSTANCE") feature_mask |= RTC_FEATURE_FLAG_INSTANCE;
            else if (feature == "INSTANCE_ARRAY") feature_mask |= RTC_FEATURE_FLAG_INSTANCE_ARRAY;
            else if (feature == "FILTER_FUNCTION_IN_ARGUMENTS") feature_mask |= RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_ARGUMENTS;
            else if (feature == "FILTER_FUNCTION_IN_GEOMETRY") feature_mask |= RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_GEOMETRY;
            else if (feature == "FILTER_FUNCTION") feature_mask |= RTC_FEATURE_FLAG_FILTER_FUNCTION;
            else if (feature == "USER_GEOMETRY_CALLBACK_IN_ARGUMENTS") feature_mask |= RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_ARGUMENTS;
            else if (feature == "USER_GEOMETRY_CALLBACK_IN_GEOMETRY") feature_mask |= RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_GEOMETRY;
            else if (feature == "USER_GEOMETRY") feature_mask |= RTC_FEATURE_FLAG_USER_GEOMETRY;
            else if (feature == "ALL") feature_mask |= RTC_FEATURE_FLAG_ALL;
            else throw std::runtime_error("unknown feature \"" + feature + "\"");
          }
          g_feature_mask = (RTCFeatureFlags) feature_mask;

        }, "--features feature1,feature2: sets feature mask for JIT compilation, e.g. TRIANGLE,QUAD");
#endif
    }